

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

void __thiscall cppforth::Forth::resizeFile(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  char cVar1;
  uint handler;
  uint uVar2;
  openmode oVar3;
  basic_fstream<char,_std::char_traits<char>_> *__p;
  uint Value;
  allocator<char> local_a1;
  path local_a0;
  uint local_74;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> fnew;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  string filename;
  
  requireDStackDepth(this,3,"RESIZE-FILE");
  this_00 = &this->dStack;
  handler = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"RESIZE-FILE",(allocator<char> *)&filename);
  GetFileHandle((Forth *)&f,(Cell)this,(string *)(ulong)handler,(errorCodes)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_74 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"RESIZE-FILE",(allocator<char> *)&filename);
  oVar3 = GetFileAccessMode(this,handler,&local_a0._M_pathname,errorResizeFile);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"RESIZE-FILE",(allocator<char> *)&fnew);
  Value = 0xffffffb6;
  GetFileName(&filename,this,handler,&local_a0._M_pathname,errorResizeFile);
  std::__cxx11::string::~string((string *)&local_a0);
  std::ios::clear((int)f.
                       super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr +
                  (int)*(undefined8 *)
                        (*(long *)f.
                                  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + -0x18));
  std::fstream::close();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_a0,&filename,auto_format);
  std::filesystem::resize_file(&local_a0,CONCAT44(uVar2,local_74));
  std::filesystem::__cxx11::path::~path(&local_a0);
  __p = (basic_fstream<char,_std::char_traits<char>_> *)operator_new(0x210);
  std::fstream::fstream(__p,(string *)&filename,oVar3);
  std::__shared_ptr<std::fstream,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<std::fstream,void>
            ((__shared_ptr<std::fstream,(__gnu_cxx::_Lock_policy)2> *)&fnew,__p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"RESIZE-FILE",&local_a1);
    MoveFileHandle(this,handler,&fnew,&local_a0._M_pathname,errorResizeFile);
    std::__cxx11::string::~string((string *)&local_a0);
    Value = 0;
  }
  ForthStack<unsigned_int>::setTop(this_00,Value);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fnew.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&filename);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void resizeFile() {
	REQUIRE_DSTACK_DEPTH(3, "RESIZE-FILE");
	auto h = (dStack.getTop()); pop();
	auto f = GetFileHandle(h, "RESIZE-FILE", errorResizeFile);
	DCell ud(dStack.getTop(1), dStack.getTop()); dStack.pop();

	auto fam = GetFileAccessMode(h, "RESIZE-FILE", errorResizeFile);
	std::string filename=GetFileName(h, "RESIZE-FILE", errorResizeFile);
	f->clear();
	f->close();
	std::filesystem::resize_file(filename,ud.data_.Dcells);
	try {
		std::shared_ptr<std::fstream> fnew{ new std::fstream(filename, fam  ) };
		if (fnew->is_open()) {
			//auto filesize = std::filesystem::file_size(filename);
			MoveFileHandle(h,  fnew,  "RESIZE-FILE", errorResizeFile);
			dStack.setTop(0);
		}
		else {
			dStack.setTop(Cell(errorResizeFile));
		}
	}
	catch (std::exception&) {
		dStack.setTop(Cell(errorResizeFile));
	}
}